

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task12.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  void *pvVar2;
  ostream *this;
  int local_28;
  int local_24;
  int j;
  int i;
  bool *b;
  int local_10;
  undefined4 uStack_c;
  bool flag;
  int a;
  
  uStack_c = 0;
  bVar1 = true;
  std::istream::operator>>((istream *)&std::cin,&local_10);
  pvVar2 = operator_new__((long)local_10);
  for (local_24 = 2; local_24 < local_10; local_24 = local_24 + 1) {
    for (local_28 = local_24 << 1; local_28 < local_10; local_28 = local_24 + local_28) {
      this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      if ((*(byte *)((long)pvVar2 + (long)local_10) & 1) != 0) {
        bVar1 = false;
        std::operator<<((ostream *)&std::cout,anon_var_dwarf_682);
        break;
      }
    }
    if (!bVar1) break;
  }
  if (pvVar2 != (void *)0x0) {
    operator_delete__(pvVar2);
  }
  return 0;
}

Assistant:

int main(){
    int a;
    bool flag = true;

    cin >> a;

    bool *b = new bool[a];
    for (int i = 2; i < a; i++){
        for (int j = 2*i; j < a; j += i){
            cout << j << endl;
            b[j] == true;
            if (b[a]){
                flag = false;
                cout << "не простое";
                break;
            }
        }
        if (!flag) break;
    }

    delete[] b;
    return 0;
}